

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Bool storeRawNames(XML_Parser parser)

{
  char *pcVar1;
  XML_Char *pXVar2;
  int iVar3;
  XML_Char *pXVar4;
  char *pcVar5;
  TAG *pTVar6;
  long lVar7;
  size_t sVar8;
  char *__dest;
  
  pTVar6 = (TAG *)&parser->m_tagStack;
  while( true ) {
    pTVar6 = pTVar6->parent;
    if (pTVar6 == (TAG *)0x0) {
      return '\x01';
    }
    lVar7 = (long)(pTVar6->name).strLen;
    pcVar5 = pTVar6->rawName;
    pcVar1 = pTVar6->buf;
    __dest = pcVar1 + lVar7 + 1;
    if (pcVar5 == __dest) break;
    lVar7 = lVar7 + 1;
    iVar3 = pTVar6->rawNameLength;
    sVar8 = (size_t)(iVar3 + (int)lVar7);
    if ((long)pTVar6->bufEnd - (long)pcVar1 < (long)sVar8) {
      pXVar4 = (XML_Char *)(*(parser->m_mem).realloc_fcn)(pcVar1,sVar8);
      if (pXVar4 == (XML_Char *)0x0) {
        return '\0';
      }
      pcVar5 = pTVar6->buf;
      if ((pTVar6->name).str == pcVar5) {
        (pTVar6->name).str = pXVar4;
      }
      pXVar2 = (pTVar6->name).localPart;
      if (pXVar2 != (XML_Char *)0x0) {
        (pTVar6->name).localPart = pXVar4 + ((long)pXVar2 - (long)pcVar5);
      }
      pTVar6->buf = pXVar4;
      pTVar6->bufEnd = pXVar4 + sVar8;
      __dest = pXVar4 + lVar7;
      pcVar5 = pTVar6->rawName;
      iVar3 = pTVar6->rawNameLength;
    }
    memcpy(__dest,pcVar5,(long)iVar3);
    pTVar6->rawName = __dest;
  }
  return '\x01';
}

Assistant:

static XML_Bool
storeRawNames(XML_Parser parser)
{
  TAG *tag = parser->m_tagStack;
  while (tag) {
    int bufSize;
    int nameLen = sizeof(XML_Char) * (tag->name.strLen + 1);
    char *rawNameBuf = tag->buf + nameLen;
    /* Stop if already stored.  Since m_tagStack is a stack, we can stop
       at the first entry that has already been copied; everything
       below it in the stack is already been accounted for in a
       previous call to this function.
    */
    if (tag->rawName == rawNameBuf)
      break;
    /* For re-use purposes we need to ensure that the
       size of tag->buf is a multiple of sizeof(XML_Char).
    */
    bufSize = nameLen + ROUND_UP(tag->rawNameLength, sizeof(XML_Char));
    if (bufSize > tag->bufEnd - tag->buf) {
      char *temp = (char *)REALLOC(parser, tag->buf, bufSize);
      if (temp == NULL)
        return XML_FALSE;
      /* if tag->name.str points to tag->buf (only when namespace
         processing is off) then we have to update it
      */
      if (tag->name.str == (XML_Char *)tag->buf)
        tag->name.str = (XML_Char *)temp;
      /* if tag->name.localPart is set (when namespace processing is on)
         then update it as well, since it will always point into tag->buf
      */
      if (tag->name.localPart)
        tag->name.localPart = (XML_Char *)temp + (tag->name.localPart -
                                                  (XML_Char *)tag->buf);
      tag->buf = temp;
      tag->bufEnd = temp + bufSize;
      rawNameBuf = temp + nameLen;
    }
    memcpy(rawNameBuf, tag->rawName, tag->rawNameLength);
    tag->rawName = rawNameBuf;
    tag = tag->parent;
  }
  return XML_TRUE;
}